

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QVariant * __thiscall
QTreeModel::data(QVariant *__return_storage_ptr__,QTreeModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  QTreeWidgetItem *pQVar2;
  QTreeModel *this_00;
  
  this_00 = (QTreeModel *)index;
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && (pQVar2 = item(this_00,index), pQVar2 != (QTreeWidgetItem *)0x0)) {
    (*pQVar2->_vptr_QTreeWidgetItem[3])
              (__return_storage_ptr__,pQVar2,(ulong)(uint)index->c,(ulong)(uint)role);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QTreeModel::data(const QModelIndex &index, int role) const
{
    if (!index.isValid())
        return QVariant();
    QTreeWidgetItem *itm = item(index);
    if (itm)
        return itm->data(index.column(), role);
    return QVariant();
}